

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

void __thiscall Centaurus::CharClass<wchar_t>::append(CharClass<wchar_t> *this,Range<wchar_t> *r)

{
  pointer pRVar1;
  pointer pRVar2;
  Range<wchar_t> *pRVar3;
  wchar_t wVar4;
  size_type __n;
  Range<wchar_t> *pRVar5;
  pointer pRVar6;
  vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *this_00;
  long lVar7;
  Range<wchar_t> *pRVar8;
  pointer pRVar9;
  
  pRVar9 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->m_ranges;
  if (((this->m_ranges).
       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
       _M_impl.super__Vector_impl_data._M_start != pRVar9) && (pRVar9[-1].m_end == r->m_start)) {
    pRVar9[-1].m_end = r->m_end;
    return;
  }
  pRVar9 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar9 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pRVar9->_vptr_Range = (_func_int **)&PTR__Range_0019a5a8;
    wVar4 = r->m_end;
    pRVar9->m_start = r->m_start;
    pRVar9->m_end = wVar4;
    (this->m_ranges).
    super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pRVar9 + 1;
    return;
  }
  __n = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
        _M_check_len(this_00,1,"vector::_M_realloc_insert");
  pRVar1 = (this_00->
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pRVar9 - (long)pRVar1 >> 4;
  if (__n == 0) {
    pRVar5 = (Range<wchar_t> *)0x0;
  }
  else {
    pRVar5 = __gnu_cxx::new_allocator<Centaurus::Range<wchar_t>_>::allocate
                       ((new_allocator<Centaurus::Range<wchar_t>_> *)this_00,__n,(void *)0x0);
  }
  pRVar5[lVar7]._vptr_Range = (_func_int **)&PTR__Range_0019a5a8;
  wVar4 = r->m_end;
  pRVar5[lVar7].m_start = r->m_start;
  pRVar5[lVar7].m_end = wVar4;
  pRVar8 = pRVar5;
  for (pRVar6 = pRVar1; pRVar6 != pRVar9; pRVar6 = pRVar6 + 1) {
    pRVar8->_vptr_Range = (_func_int **)&PTR__Range_0019a5a8;
    wVar4 = pRVar6->m_end;
    pRVar8->m_start = pRVar6->m_start;
    pRVar8->m_end = wVar4;
    pRVar8 = pRVar8 + 1;
  }
  for (; pRVar3 = pRVar8 + 1, pRVar6 = pRVar1, pRVar2 != pRVar9; pRVar9 = pRVar9 + 1) {
    pRVar3->_vptr_Range = (_func_int **)&PTR__Range_0019a5a8;
    wVar4 = pRVar9->m_end;
    pRVar8[1].m_start = pRVar9->m_start;
    pRVar8[1].m_end = wVar4;
    pRVar8 = pRVar3;
  }
  for (; pRVar6 != pRVar2; pRVar6 = pRVar6 + 1) {
    (**pRVar6->_vptr_Range)(pRVar6);
  }
  if (pRVar1 != (pointer)0x0) {
    operator_delete(pRVar1);
  }
  (this_00->
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>).
  _M_impl.super__Vector_impl_data._M_start = pRVar5;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = pRVar3;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = pRVar5 + __n;
  return;
}

Assistant:

void append(const Range<TCHAR>& r)
    {
        if (m_ranges.empty())
        {
            m_ranges.push_back(r);
        }
        else
        {
            if (m_ranges.back().end() == r.start())
            {
                m_ranges.back().end(r.end());
            }
            else
            {
                m_ranges.push_back(r);
            }
        }
    }